

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

uint __thiscall ON_3dPointListRef::SetFromMesh(ON_3dPointListRef *this,ON_Mesh *mesh)

{
  bool bVar1;
  uint uVar2;
  ON_3dPoint *point_array;
  ON_3fPoint *point_array_00;
  uint local_34;
  uint vertex_count;
  ON_Mesh *mesh_local;
  ON_3dPointListRef *this_local;
  
  if ((mesh == (ON_Mesh *)0x0) || (uVar2 = ON_Mesh::VertexUnsignedCount(mesh), uVar2 == 0)) {
    uVar2 = EmptyPointList.m_point_stride;
    this->m_point_count = EmptyPointList.m_point_count;
    this->m_point_stride = uVar2;
    this->m_dP = EmptyPointList.m_dP;
    this->m_fP = EmptyPointList.m_fP;
    this_local._4_4_ = this->m_point_count;
  }
  else {
    bVar1 = ON_Mesh::HasDoublePrecisionVertices(mesh);
    if (bVar1) {
      point_array = ON_SimpleArray<ON_3dPoint>::Array
                              (&(mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>);
      local_34 = SetFromDoubleArray(this,(ulong)uVar2,3,&point_array->x);
    }
    else {
      point_array_00 =
           ON_SimpleArray<ON_3fPoint>::Array(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
      local_34 = SetFromFloatArray(this,(ulong)uVar2,3,&point_array_00->x);
    }
    this_local._4_4_ = local_34;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_3dPointListRef::SetFromMesh(
  const class ON_Mesh* mesh
  )
{
  if ( 0 != mesh )
  {
    const unsigned int vertex_count = mesh->VertexUnsignedCount();
    if ( vertex_count > 0 )
    {
      return (mesh->HasDoublePrecisionVertices())
      ? SetFromDoubleArray(vertex_count,3,(const double*)(mesh->m_dV.Array()))
      : SetFromFloatArray(vertex_count,3,(const float*)(mesh->m_V.Array()));
    }
  }
  *this = ON_3dPointListRef::EmptyPointList;
  return m_point_count;
}